

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O3

ptr<std::vector<ptr<log_entry>_>_> __thiscall
nuraft::inmem_log_store::log_entries_ext
          (inmem_log_store *this,ulong start,ulong end,int64 batch_size_hint_in_bytes)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  long lVar2;
  log_entry *this_00;
  vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
  *this_01;
  int iVar3;
  undefined8 *puVar4;
  buffer *this_02;
  size_t sVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  long lVar8;
  long in_R8;
  ulong uVar9;
  bool bVar10;
  ptr<std::vector<ptr<log_entry>_>_> pVar11;
  ptr<log_entry> src;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ptr<log_entry> local_40;
  
  local_50 = start;
  puVar4 = (undefined8 *)operator_new(0x28);
  puVar4[1] = 0x100000001;
  *puVar4 = &PTR___Sp_counted_ptr_inplace_001cf0a8;
  puVar4[2] = 0;
  puVar4[3] = 0;
  puVar4[4] = 0;
  *(undefined8 **)&(this->logs_)._M_t._M_impl = puVar4;
  (this->super_log_store)._vptr_log_store = (_func_int **)(puVar4 + 2);
  _Var7._M_pi = extraout_RDX;
  if (end < (ulong)batch_size_hint_in_bytes && -1 < in_R8) {
    __mutex = (pthread_mutex_t *)(local_50 + 0x38);
    lVar1 = local_50 + 0x10;
    local_58 = in_R8 - 1;
    uVar9 = 0;
    local_48 = batch_size_hint_in_bytes;
    do {
      _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      iVar3 = pthread_mutex_lock(__mutex);
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      lVar2 = *(long *)(local_50 + 0x18);
      lVar6 = lVar2;
      lVar8 = lVar1;
      if (lVar2 != 0) {
        do {
          bVar10 = *(ulong *)(lVar6 + 0x20) < end;
          if (!bVar10) {
            lVar8 = lVar6;
          }
          lVar6 = *(long *)(lVar6 + 0x10 + (ulong)bVar10 * 8);
        } while (lVar6 != 0);
        if ((lVar8 == lVar1) || (end < *(ulong *)(lVar8 + 0x20))) {
          do {
            lVar6 = lVar2;
            lVar2 = *(long *)(lVar6 + 0x10);
          } while (*(long *)(lVar6 + 0x10) != 0);
          lVar8 = lVar1;
          if ((lVar6 != lVar1) && (lVar8 = lVar6, *(long *)(lVar6 + 0x20) != 0)) {
            lVar8 = lVar1;
          }
        }
      }
      this_00 = *(log_entry **)(lVar8 + 0x28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_60,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar8 + 0x30));
      pthread_mutex_unlock(__mutex);
      this_01 = (vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
                 *)(this->super_log_store)._vptr_log_store;
      make_clone(&local_40);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
      ::emplace_back<std::shared_ptr<nuraft::log_entry>>(this_01,&local_40);
      if (local_40.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      this_02 = log_entry::get_buf(this_00);
      sVar5 = buffer::size(this_02);
      uVar9 = uVar9 + sVar5;
      _Var7._M_pi = extraout_RDX_00;
      if (local_58 < uVar9) {
        if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
          _Var7._M_pi = extraout_RDX_02;
        }
        break;
      }
      if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
        _Var7._M_pi = extraout_RDX_01;
      }
      end = end + 1;
    } while (end != local_48);
  }
  pVar11.
  super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var7._M_pi;
  pVar11.
  super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<std::vector<ptr<log_entry>_>_>)
         pVar11.
         super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<std::vector<ptr<log_entry>>>
    inmem_log_store::log_entries_ext(ulong start,
                                     ulong end,
                                     int64 batch_size_hint_in_bytes)
{
    ptr< std::vector< ptr<log_entry> > > ret =
        cs_new< std::vector< ptr<log_entry> > >();

    if (batch_size_hint_in_bytes < 0) {
        return ret;
    }

    size_t accum_size = 0;
    for (ulong ii = start ; ii < end ; ++ii) {
        ptr<log_entry> src = nullptr;
        {   std::lock_guard<std::mutex> l(logs_lock_);
            auto entry = logs_.find(ii);
            if (entry == logs_.end()) {
                entry = logs_.find(0);
                assert(0);
            }
            src = entry->second;
        }
        ret->push_back(make_clone(src));
        accum_size += src->get_buf().size();
        if (batch_size_hint_in_bytes &&
            accum_size >= (ulong)batch_size_hint_in_bytes) break;
    }
    return ret;
}